

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_graphics_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  VkGraphicsPipelineCreateInfo *pVVar1;
  Value *pVVar2;
  DatabaseInterface *pDVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  SizeType SVar7;
  Ch *pCVar8;
  size_type sVar9;
  VkGraphicsPipelineCreateInfo *pVVar10;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar11;
  VkPipelineCreateFlags2KHR VVar12;
  pointer ppVar13;
  mapped_type *ppVVar14;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false> local_70;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false> local_68;
  iterator rp_itr;
  uint64_t render_pass;
  VkGraphicsPipelineCreateInfo *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  VkGraphicsPipelineCreateInfo *info_allocated;
  Hash hash;
  Value *member_local;
  Value *pipelines_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  hash = (Hash)member;
  member_local = pipelines;
  pipelines_local = (Value *)resolver;
  resolver_local = (DatabaseInterface *)iface;
  iface_local = (StateCreatorInterface *)this;
  pCVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(member);
  info_allocated = (VkGraphicsPipelineCreateInfo *)string_to_uint64(pCVar8);
  sVar9 = std::
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          ::count(&this->replayed_graphics_pipelines,(key_type *)&info_allocated);
  if (sVar9 == 0) {
    pVVar10 = ScratchAllocator::allocate_cleared<VkGraphicsPipelineCreateInfo>(&this->allocator);
    this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)member_local,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)hash);
    pVVar10->sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"flags");
    uVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar11);
    pVVar10->flags = uVar5;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"basePipelineIndex");
    iVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar11);
    pVVar10->basePipelineIndex = iVar6;
    VVar12 = normalize_pipeline_creation_flags((ulong)pVVar10->flags);
    pDVar3 = resolver_local;
    pVVar2 = pipelines_local;
    pVVar10->flags = (VkPipelineCreateFlags)VVar12;
    pGVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"basePipelineHandle");
    bVar4 = parse_derived_pipeline_handle
                      (this,(StateCreatorInterface *)pDVar3,(DatabaseInterface *)pVVar2,pGVar11,
                       member_local,RESOURCE_GRAPHICS_PIPELINE,&pVVar10->basePipelineHandle);
    if (bVar4) {
      pGVar11 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(this_00,"layout");
      bVar4 = parse_pipeline_layout_handle(this,pGVar11,&pVVar10->layout);
      if (bVar4) {
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_00,"renderPass");
        pCVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pGVar11);
        rp_itr.super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>)
                 string_to_uint64(pCVar8);
        if (rp_itr.
            super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>.
            _M_cur != (__node_type *)0x0) {
          local_68._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
               ::find(&this->replayed_render_passes,(key_type *)&rp_itr);
          local_70._M_cur =
               (__node_type *)
               std::
               end<std::unordered_map<unsigned_long,VkRenderPass_T*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,VkRenderPass_T*>>>>
                         (&this->replayed_render_passes);
          bVar4 = std::__detail::operator==(&local_68,&local_70);
          if (bVar4) {
            log_missing_resource
                      ("Render pass",
                       (Hash)rp_itr.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>
                             ._M_cur);
            return false;
          }
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false,_false>
                                *)&local_68);
          if (ppVar13->second == (VkRenderPass_T *)0x0) {
            log_invalid_resource
                      ("Render pass",
                       (Hash)rp_itr.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false>
                             ._M_cur);
            return false;
          }
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_long,_VkRenderPass_T_*>,_false,_false>
                                *)&local_68);
          pVVar10->renderPass = ppVar13->second;
        }
        pGVar11 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_00,"subpass");
        uVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint(pGVar11);
        pVVar10->subpass = uVar5;
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"stages");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"stages");
          SVar7 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Size(pGVar11);
          pDVar3 = resolver_local;
          pVVar2 = pipelines_local;
          pVVar10->stageCount = SVar7;
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"stages");
          bVar4 = parse_stages(this,(StateCreatorInterface *)pDVar3,(DatabaseInterface *)pVVar2,
                               pGVar11,&pVVar10->pStages);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"rasterizationState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"rasterizationState");
          bVar4 = parse_rasterization_state(this,pGVar11,&pVVar10->pRasterizationState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"tessellationState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"tessellationState");
          bVar4 = parse_tessellation_state(this,pGVar11,&pVVar10->pTessellationState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"colorBlendState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"colorBlendState");
          bVar4 = parse_color_blend_state(this,pGVar11,&pVVar10->pColorBlendState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"depthStencilState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"depthStencilState");
          bVar4 = parse_depth_stencil_state(this,pGVar11,&pVVar10->pDepthStencilState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"dynamicState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"dynamicState");
          bVar4 = parse_dynamic_state(this,pGVar11,&pVVar10->pDynamicState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"viewportState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"viewportState");
          bVar4 = parse_viewport_state(this,pGVar11,&pVVar10->pViewportState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"multisampleState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"multisampleState");
          bVar4 = parse_multisample_state(this,pGVar11,&pVVar10->pMultisampleState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"inputAssemblyState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"inputAssemblyState");
          bVar4 = parse_input_assembly_state(this,pGVar11,&pVVar10->pInputAssemblyState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"vertexInputState");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"vertexInputState");
          bVar4 = parse_vertex_input_state(this,pGVar11,&pVVar10->pVertexInputState);
          if (!bVar4) {
            return false;
          }
        }
        bVar4 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"pNext");
        if (bVar4) {
          pGVar11 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"pNext");
          bVar4 = parse_pnext_chain(this,pGVar11,&pVVar10->pNext,
                                    (StateCreatorInterface *)resolver_local,
                                    (DatabaseInterface *)pipelines_local,member_local);
          if (!bVar4) {
            return false;
          }
        }
        pDVar3 = resolver_local;
        pVVar1 = info_allocated;
        ppVVar14 = std::
                   unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                   ::operator[](&this->replayed_graphics_pipelines,(key_type *)&info_allocated);
        uVar5 = (*pDVar3->_vptr_DatabaseInterface[0xc])(pDVar3,pVVar1,pVVar10,ppVVar14);
        if ((uVar5 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool StateReplayer::Impl::parse_graphics_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_graphics_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkGraphicsPipelineCreateInfo>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_GRAPHICS_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	auto render_pass = string_to_uint64(obj["renderPass"].GetString());
	if (render_pass > 0)
	{
		auto rp_itr = replayed_render_passes.find(render_pass);
		if (rp_itr == end(replayed_render_passes))
		{
			log_missing_resource("Render pass", render_pass);
			return false;
		}
		else if (rp_itr->second == VK_NULL_HANDLE)
		{
			log_invalid_resource("Render pass", render_pass);
			return false;
		}
		else
			info.renderPass = rp_itr->second;
	}

	info.subpass = obj["subpass"].GetUint();

	if (obj.HasMember("stages"))
	{
		info.stageCount = obj["stages"].Size();
		if (!parse_stages(iface, resolver, obj["stages"], &info.pStages))
			return false;
	}

	if (obj.HasMember("rasterizationState"))
		if (!parse_rasterization_state(obj["rasterizationState"], &info.pRasterizationState))
			return false;

	if (obj.HasMember("tessellationState"))
		if (!parse_tessellation_state(obj["tessellationState"], &info.pTessellationState))
			return false;

	if (obj.HasMember("colorBlendState"))
		if (!parse_color_blend_state(obj["colorBlendState"], &info.pColorBlendState))
			return false;

	if (obj.HasMember("depthStencilState"))
		if (!parse_depth_stencil_state(obj["depthStencilState"], &info.pDepthStencilState))
			return false;

	if (obj.HasMember("dynamicState"))
		if (!parse_dynamic_state(obj["dynamicState"], &info.pDynamicState))
			return false;

	if (obj.HasMember("viewportState"))
		if (!parse_viewport_state(obj["viewportState"], &info.pViewportState))
			return false;

	if (obj.HasMember("multisampleState"))
		 if (!parse_multisample_state(obj["multisampleState"], &info.pMultisampleState))
		 	return false;

	if (obj.HasMember("inputAssemblyState"))
		if (!parse_input_assembly_state(obj["inputAssemblyState"], &info.pInputAssemblyState))
			return false;

	if (obj.HasMember("vertexInputState"))
		if (!parse_vertex_input_state(obj["vertexInputState"], &info.pVertexInputState))
			return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext, &iface, resolver, &pipelines))
			return false;

	if (!iface.enqueue_create_graphics_pipeline(hash, &info, &replayed_graphics_pipelines[hash]))
		return false;

	return true;
}